

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_test.cc
# Opt level: O0

void __thiscall leveldb::DBTest_EmptyKey_Test::~DBTest_EmptyKey_Test(DBTest_EmptyKey_Test *this)

{
  DBTest_EmptyKey_Test *this_local;
  
  ~DBTest_EmptyKey_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(DBTest, EmptyKey) {
  do {
    ASSERT_LEVELDB_OK(Put("", "v1"));
    ASSERT_EQ("v1", Get(""));
    ASSERT_LEVELDB_OK(Put("", "v2"));
    ASSERT_EQ("v2", Get(""));
  } while (ChangeOptions());
}